

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

int yy_tight_or(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  code *action;
  char *name;
  int iVar6;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar6 = 0;
  yyDo(G,yyPush,2,0,"yyPush");
  iVar3 = yy_tight_and(G);
  if (iVar3 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
  }
  else {
    yyDo(G,yySet,-2,0,"yySet");
    do {
      iVar1 = G->pos;
      iVar2 = G->thunkpos;
      do {
        iVar3 = G->pos;
        iVar6 = G->thunkpos;
        iVar4 = yy_ws(G);
      } while (iVar4 != 0);
      G->pos = iVar3;
      G->thunkpos = iVar6;
      iVar3 = yymatchString(G,"||");
      if (iVar3 == 0) {
LAB_00112b23:
        G->pos = iVar1;
        G->thunkpos = iVar2;
        do {
          iVar3 = G->pos;
          iVar6 = G->thunkpos;
          iVar4 = yy_ws(G);
        } while (iVar4 != 0);
        G->pos = iVar3;
        G->thunkpos = iVar6;
        iVar3 = yymatchString(G,"^^");
        if (iVar3 != 0) {
          do {
            iVar3 = G->pos;
            iVar6 = G->thunkpos;
            iVar4 = yy_ws(G);
          } while (iVar4 != 0);
          G->pos = iVar3;
          G->thunkpos = iVar6;
          iVar3 = yy_tight_and(G);
          if (iVar3 != 0) {
            yyDo(G,yySet,-1,0,"yySet");
            iVar3 = G->begin;
            iVar6 = G->end;
            action = yy_2_tight_or;
            name = "yy_2_tight_or";
            goto LAB_00112bb7;
          }
        }
        G->pos = iVar1;
        G->thunkpos = iVar2;
        do {
          iVar3 = G->pos;
          iVar6 = G->thunkpos;
          iVar4 = yy_ws(G);
        } while (iVar4 != 0);
        G->pos = iVar3;
        G->thunkpos = iVar6;
        iVar3 = yymatchString(G,"//");
        iVar6 = 7;
        if (iVar3 != 0) {
          do {
            iVar3 = G->pos;
            iVar4 = G->thunkpos;
            iVar5 = yy_ws(G);
          } while (iVar5 != 0);
          G->pos = iVar3;
          G->thunkpos = iVar4;
          iVar3 = yy_tight_and(G);
          if (iVar3 != 0) {
            iVar6 = 0;
            yyDo(G,yySet,-1,0,"yySet");
            yyDo(G,yy_3_tight_or,G->begin,G->end,"yy_3_tight_or");
          }
        }
      }
      else {
        do {
          iVar3 = G->pos;
          iVar6 = G->thunkpos;
          iVar4 = yy_ws(G);
        } while (iVar4 != 0);
        G->pos = iVar3;
        G->thunkpos = iVar6;
        iVar3 = yy_tight_and(G);
        if (iVar3 == 0) goto LAB_00112b23;
        yyDo(G,yySet,-1,0,"yySet");
        iVar3 = G->begin;
        iVar6 = G->end;
        action = yy_1_tight_or;
        name = "yy_1_tight_or";
LAB_00112bb7:
        yyDo(G,action,iVar3,iVar6,name);
        iVar6 = 5;
      }
      if (iVar6 == 0) {
LAB_00112bdb:
        iVar6 = 3;
      }
      else if (iVar6 == 7) {
        G->pos = iVar1;
        G->thunkpos = iVar2;
        iVar6 = 0;
      }
      else if (iVar6 == 5) goto LAB_00112bdb;
    } while (iVar6 != 0);
    yyDo(G,yy_4_tight_or,G->begin,G->end,"yy_4_tight_or");
    yyDo(G,yyPop,2,0,"yyPop");
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

YY_RULE(int) yy_tight_or(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 2, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "tight_or"));
  if (!yy_tight_and(G))  goto l701;
  yyDo(G, yySet, -2, 0, "yySet");

  l702:;	
  {  int yypos703= G->pos, yythunkpos703= G->thunkpos;
  {  int yypos704= G->pos, yythunkpos704= G->thunkpos;  if (!yy__(G))  goto l705;
  if (!yymatchString(G, "||")) goto l705;
  if (!yy__(G))  goto l705;
  if (!yy_tight_and(G))  goto l705;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_1_tight_or, G->begin, G->end, "yy_1_tight_or");
  goto l704;
  l705:;	  G->pos= yypos704; G->thunkpos= yythunkpos704;  if (!yy__(G))  goto l706;
  if (!yymatchString(G, "^^")) goto l706;
  if (!yy__(G))  goto l706;
  if (!yy_tight_and(G))  goto l706;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_2_tight_or, G->begin, G->end, "yy_2_tight_or");
  goto l704;
  l706:;	  G->pos= yypos704; G->thunkpos= yythunkpos704;  if (!yy__(G))  goto l703;
  if (!yymatchString(G, "//")) goto l703;
  if (!yy__(G))  goto l703;
  if (!yy_tight_and(G))  goto l703;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_3_tight_or, G->begin, G->end, "yy_3_tight_or");

  }
  l704:;	  goto l702;
  l703:;	  G->pos= yypos703; G->thunkpos= yythunkpos703;
  }  yyDo(G, yy_4_tight_or, G->begin, G->end, "yy_4_tight_or");
  yyprintf((stderr, "  ok   tight_or"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 2, 0, "yyPop");
  return 1;
  l701:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "tight_or"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}